

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

void ma_pcm_s16_to_s32(void *dst,void *src,ma_uint64 count,ma_dither_mode ditherMode)

{
  ma_uint64 i;
  
  for (i = 0; count != i; i = i + 1) {
    *(uint *)((long)dst + i * 4) = (uint)*(ushort *)((long)src + i * 2) << 0x10;
  }
  return;
}

Assistant:

MA_API void ma_pcm_s16_to_s32(void* dst, const void* src, ma_uint64 count, ma_dither_mode ditherMode)
{
#ifdef MA_USE_REFERENCE_CONVERSION_APIS
    ma_pcm_s16_to_s32__reference(dst, src, count, ditherMode);
#else
    #  if defined(MA_SUPPORT_SSE2)
        if (ma_has_sse2()) {
            ma_pcm_s16_to_s32__sse2(dst, src, count, ditherMode);
        } else
    #elif defined(MA_SUPPORT_NEON)
        if (ma_has_neon()) {
            ma_pcm_s16_to_s32__neon(dst, src, count, ditherMode);
        } else
    #endif
        {
            ma_pcm_s16_to_s32__optimized(dst, src, count, ditherMode);
        }
#endif
}